

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeRegListOperand(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint RegLst;
  uint i;
  uint RegNum;
  uint Regs [8];
  uint local_50;
  uint local_48 [14];
  MCInst *local_10;
  DecodeStatus local_4;
  
  local_48[0] = 0x116;
  local_48[1] = 0x117;
  local_48[2] = 0x118;
  local_48[3] = 0x119;
  local_48[4] = 0x11a;
  local_48[5] = 0x11b;
  local_48[6] = 0x11c;
  local_48[7] = 8;
  local_10 = in_RDI;
  uVar2 = fieldFromInstruction(in_ESI,0x15,5);
  if (uVar2 == 0) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    local_50 = 0;
    while( true ) {
      uVar1 = uVar2 & 0xf;
      if (7 < (uVar2 & 0xf)) {
        uVar1 = 8;
      }
      if (uVar1 <= local_50) break;
      MCOperand_CreateReg0(local_10,local_48[local_50]);
      local_50 = local_50 + 1;
    }
    if ((uVar2 & 0x10) != 0) {
      MCOperand_CreateReg0(local_10,0x13);
    }
    local_4 = MCDisassembler_Success;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeRegListOperand(MCInst *Inst, unsigned Insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	unsigned Regs[] = {Mips_S0, Mips_S1, Mips_S2, Mips_S3, Mips_S4, Mips_S5,
		Mips_S6, Mips_FP};
	unsigned RegNum;
	unsigned int i;

	unsigned RegLst = fieldFromInstruction(Insn, 21, 5);
	// Empty register lists are not allowed.
	if (RegLst == 0)
		return MCDisassembler_Fail;

	RegNum = RegLst & 0xf;
	for (i = 0; i < MIN(RegNum, ARR_SIZE(Regs)); i++)
		MCOperand_CreateReg0(Inst, Regs[i]);

	if (RegLst & 0x10)
		MCOperand_CreateReg0(Inst, Mips_RA);

	return MCDisassembler_Success;
}